

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeDeleteAuxData(VdbeFunc *pVdbeFunc,int mask)

{
  ulong uVar1;
  AuxData *pAVar2;
  
  pAVar2 = pVdbeFunc->apAux;
  for (uVar1 = 0; (long)uVar1 < (long)pVdbeFunc->nAux; uVar1 = uVar1 + 1) {
    if (((0x1f < uVar1) || (((uint)mask >> ((uint)uVar1 & 0x1f) & 1) == 0)) &&
       (pAVar2->pAux != (void *)0x0)) {
      if (pAVar2->xDelete != (_func_void_void_ptr *)0x0) {
        (*pAVar2->xDelete)(pAVar2->pAux);
      }
      pAVar2->pAux = (void *)0x0;
    }
    pAVar2 = pAVar2 + 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeDeleteAuxData(VdbeFunc *pVdbeFunc, int mask){
  int i;
  for(i=0; i<pVdbeFunc->nAux; i++){
    struct AuxData *pAux = &pVdbeFunc->apAux[i];
    if( (i>31 || !(mask&(((u32)1)<<i))) && pAux->pAux ){
      if( pAux->xDelete ){
        pAux->xDelete(pAux->pAux);
      }
      pAux->pAux = 0;
    }
  }
}